

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relayer.cpp
# Opt level: O0

void __thiscall TcpRelayer::onAccept(TcpRelayer *this,Connection *conn)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  TimerId TVar2;
  anon_class_40_3_155447e0 local_f0;
  Connector local_c8;
  enable_shared_from_this<Liby::Connection> local_a8;
  undefined1 local_98 [8];
  RelayerContext context;
  BasicHandler local_70;
  Timestamp local_40;
  TimerId local_30;
  TimerId id;
  shared_ptr<Liby::TcpClient> tcpClient;
  Connection *conn_local;
  TcpRelayer *this_local;
  
  tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)conn;
  Liby::EventLoopGroup::creatTcpClient((EventLoopGroup *)&id,(string *)this->group_,&this->host_);
  peVar1 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&id);
  Liby::Timestamp::Timestamp(&local_40,8,0);
  this_00 = &context.weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<Liby::TcpClient>::shared_ptr
            ((shared_ptr<Liby::TcpClient> *)this_00,(shared_ptr<Liby::TcpClient> *)&id);
  std::function<void()>::function<TcpRelayer::onAccept(Liby::Connection&)::_lambda()_1_,void>
            ((function<void()> *)&local_70,(anon_class_16_1_0de0f9ac *)this_00);
  TVar2 = Liby::TimerMixin::runAfter(&peVar1->super_TimerMixin,&local_40,&local_70);
  std::function<void_()>::~function(&local_70);
  onAccept(Liby::Connection&)::{lambda()#1}::~Connection
            ((_lambda___1_ *)
             &context.weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_30 = TVar2;
  RelayerContext::RelayerContext((RelayerContext *)local_98);
  std::enable_shared_from_this<Liby::Connection>::shared_from_this(&local_a8);
  std::weak_ptr<Liby::Connection>::operator=
            ((weak_ptr<Liby::Connection> *)&context,(shared_ptr<Liby::Connection> *)&local_a8);
  std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)&local_a8);
  peVar1 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&id);
  local_f0.this = this;
  RelayerContext::RelayerContext(&local_f0.context,(RelayerContext *)local_98);
  local_f0.id = local_30;
  std::function<void(std::shared_ptr<Liby::Connection>)>::
  function<TcpRelayer::onAccept(Liby::Connection&)::_lambda(std::shared_ptr<Liby::Connection>)_1_,void>
            ((function<void(std::shared_ptr<Liby::Connection>)> *)&local_c8,&local_f0);
  Liby::TcpClient::onConnect(peVar1,&local_c8);
  std::function<void_(std::shared_ptr<Liby::Connection>)>::~function(&local_c8);
  onAccept(Liby::Connection&)::{lambda(std::shared_ptr<Liby::Connection>)#1}::~shared_ptr
            ((_lambda_std__shared_ptr<Liby::Connection>__1_ *)&local_f0);
  RelayerContext::~RelayerContext((RelayerContext *)local_98);
  std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)&id);
  return;
}

Assistant:

void onAccept(Connection &conn) {
        shared_ptr<TcpClient> tcpClient =
            group_.creatTcpClient(host_, service_);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        RelayerContext context;
        context.weak_conn = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                RelayerContext context1;
                context1.weak_conn = c;
                c->context_ = make_shared<RelayerContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<RelayerContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }